

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::clear(QAbstractSpinBox *this)

{
  QAbstractSpinBoxPrivate *pQVar1;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *d;
  QStringBuilder<QString_&,_QString_&> *this_00;
  int pos;
  QString *in_stack_ffffffffffffffb0;
  QLineEdit *this_01;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QAbstractSpinBox *)0x6859b5);
  this_00 = (QStringBuilder<QString_&,_QString_&> *)pQVar1->edit;
  ::operator+(in_stack_ffffffffffffffb0,(QString *)this_00);
  this_01 = (QLineEdit *)&stack0xffffffffffffffe0;
  ::QStringBuilder::operator_cast_to_QString(this_00);
  QLineEdit::setText(this_01,(QString *)this_00);
  pos = (int)((ulong)this_00 >> 0x20);
  QString::~QString((QString *)0x685a16);
  QString::size(&pQVar1->prefix);
  QLineEdit::setCursorPosition(this_01,pos);
  *(ushort *)&pQVar1->field_0x3d0 = *(ushort *)&pQVar1->field_0x3d0 | 0x80;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::clear()
{
    Q_D(QAbstractSpinBox);

    d->edit->setText(d->prefix + d->suffix);
    d->edit->setCursorPosition(d->prefix.size());
    d->cleared = true;
}